

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O0

MPP_RET mpp_trie_last_info(MppTrie trie)

{
  short sVar1;
  long lVar2;
  RK_S16 RVar3;
  MppTrieNode *pMVar4;
  uint *puVar5;
  char *name_00;
  uint *puVar6;
  MppTrieInfo *info_00;
  undefined4 *puVar7;
  RK_U64 in_stack_ffffffffffffff30;
  undefined4 uVar8;
  MppTrieInfo *info;
  char *name;
  MppTrieInfo *dst;
  MppTrieInfoInt *src;
  RK_S32 k;
  MppTrieNode *prev_1;
  MppTrieNode *tmp;
  RK_S32 prev_idx;
  MppTrieNode *prev;
  uint local_58;
  RK_S32 j;
  RK_S32 i;
  RK_S32 pos;
  RK_S32 len;
  RK_S32 nodes_size;
  RK_S32 node_valid;
  RK_S32 node_count;
  char *buf;
  MppTrieNode *node;
  MppTrieNode *root;
  MppTrieImpl *p;
  MppTrie trie_local;
  
  i = 0;
  j = 0;
  root = (MppTrieNode *)trie;
  p = (MppTrieImpl *)trie;
  if (trie == (MppTrie)0x0) {
    _mpp_log_l(2,"mpp_trie","invalid NULL trie\n","mpp_trie_last_info");
    trie_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    j = *(int *)((long)trie + 0x18) + 3;
    mpp_trie_add_info(trie,"__name__",*trie,*(RK_U32 *)((long)trie + 8));
    mpp_trie_add_info(p,"__info__",&j,4);
    mpp_trie_add_info(p,"__node__",(void *)((long)&root->tag_val + 4),4);
    node = *(MppTrieNode **)&root->key;
    len = *(uint *)((long)&root->tag_val + 4);
    nodes_size = len;
    if ((mpp_trie_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_trie","shrink trie node start node %d info %d\n","mpp_trie_last_info",
                 (ulong)(uint)len,(ulong)*(uint *)(root->next + 0xc));
    }
    local_58 = nodes_size;
    if ((mpp_trie_debug & 0x40) != 0) {
      mpp_trie_dump(p,"mpp_trie_last_info");
      local_58 = nodes_size;
    }
    while (local_58 = local_58 - 1, 0 < (int)local_58) {
      buf = (char *)(node + (int)local_58);
      sVar1 = ((MppTrieNode *)buf)->prev;
      pMVar4 = node + (int)sVar1;
      uVar8 = (undefined4)(in_stack_ffffffffffffff30 >> 0x20);
      if (pMVar4->next_cnt < 2) {
        if (((MppTrieNode *)buf)->tag_len < 0x10) {
          if (pMVar4->id < 0) {
            pMVar4->id = ((MppTrieNode *)buf)->id;
            pMVar4->tag_len = ((MppTrieNode *)buf)->tag_len + 1;
            pMVar4->tag_val =
                 (ulong)((MppTrieNode *)buf)->key <<
                 ((byte)((int)((MppTrieNode *)buf)->tag_len << 2) & 0x3f) |
                 ((MppTrieNode *)buf)->tag_val;
            pMVar4->next_cnt = ((MppTrieNode *)buf)->next_cnt;
            *(undefined8 *)pMVar4->next = *(undefined8 *)((MppTrieNode *)buf)->next;
            *(undefined8 *)(pMVar4->next + 4) = *(undefined8 *)(((MppTrieNode *)buf)->next + 4);
            *(undefined8 *)(pMVar4->next + 8) = *(undefined8 *)(((MppTrieNode *)buf)->next + 8);
            *(undefined8 *)(pMVar4->next + 0xc) = *(undefined8 *)(((MppTrieNode *)buf)->next + 0xc);
            if ((mpp_trie_debug & 0x20) != 0) {
              in_stack_ffffffffffffff30 = CONCAT44(uVar8,(uint)pMVar4->key);
              _mpp_log_l(4,"mpp_trie","node %d:%d shrink prev %d key %x tag %016llx -> %016llx\n",
                         "mpp_trie_last_info",(ulong)local_58,(ulong)(uint)((MppTrieNode *)buf)->id,
                         (int)pMVar4->idx,in_stack_ffffffffffffff30,((MppTrieNode *)buf)->tag_val,
                         pMVar4->tag_val);
            }
            for (prev._4_4_ = 0; (int)prev._4_4_ < 0x10; prev._4_4_ = prev._4_4_ + 1) {
              if (pMVar4->next[(int)prev._4_4_] != 0) {
                node[pMVar4->next[(int)prev._4_4_]].prev = sVar1;
              }
            }
            memset(buf,0,0x38);
            buf[0x20] = -1;
            buf[0x21] = -1;
            buf[0x22] = -1;
            buf[0x23] = -1;
            len = len + -1;
          }
          else if ((mpp_trie_debug & 0x20) != 0) {
            in_stack_ffffffffffffff30 = ((MppTrieNode *)buf)->tag_val;
            _mpp_log_l(4,"mpp_trie",
                       "node %d:%d tag %d - %016llx stop shrinking for valid info node\n",
                       "mpp_trie_last_info",(ulong)local_58,(ulong)(uint)((MppTrieNode *)buf)->id,
                       (int)((MppTrieNode *)buf)->tag_len,in_stack_ffffffffffffff30);
          }
        }
        else if ((mpp_trie_debug & 0x20) != 0) {
          in_stack_ffffffffffffff30 = ((MppTrieNode *)buf)->tag_val;
          _mpp_log_l(4,"mpp_trie","node %d:%d tag %d - %016llx stop shrinking for max tag len\n",
                     "mpp_trie_last_info",(ulong)local_58,(ulong)(uint)((MppTrieNode *)buf)->id,
                     (int)((MppTrieNode *)buf)->tag_len,in_stack_ffffffffffffff30);
        }
      }
      else if ((mpp_trie_debug & 0x20) != 0) {
        in_stack_ffffffffffffff30 = CONCAT44(uVar8,(uint)pMVar4->next_cnt);
        _mpp_log_l(4,"mpp_trie","node %d:%d prev %d next count %d stop shrinking for multi next\n",
                   "mpp_trie_last_info",(ulong)local_58,(ulong)(uint)((MppTrieNode *)buf)->id,
                   (int)sVar1,in_stack_ffffffffffffff30);
      }
    }
    if ((mpp_trie_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_trie","shrink trie node finish count %d -> %d\n","mpp_trie_last_info",
                 (ulong)(uint)nodes_size,(ulong)(uint)len);
    }
    if ((mpp_trie_debug & 0x40) != 0) {
      mpp_trie_dump(p,"mpp_trie_last_info");
    }
    if ((mpp_trie_debug & 0x80) != 0) {
      mpp_trie_check(p,"shrink merge tag stage");
    }
    if ((mpp_trie_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_trie","move trie node start to reduce memory %d -> %d\n",
                 "mpp_trie_last_info",(ulong)(uint)nodes_size,(ulong)(uint)len);
    }
    local_58 = 1;
LAB_00150159:
    if ((int)local_58 < len) {
      buf = (char *)(node + (int)local_58);
      if (((MppTrieNode *)buf)->idx == 0) {
        for (prev._4_4_ = local_58; (int)prev._4_4_ < nodes_size; prev._4_4_ = prev._4_4_ + 1) {
          pMVar4 = node + (int)prev._4_4_;
          if (pMVar4->idx != 0) {
            if ((mpp_trie_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_trie","move node %d to %d prev %d\n","mpp_trie_last_info",
                         (ulong)prev._4_4_,(ulong)local_58,(int)pMVar4->prev);
            }
            src._4_4_ = 0;
            goto LAB_00150225;
          }
        }
      }
      goto LAB_001502f1;
    }
    *(RK_S32 *)((long)&root->tag_val + 4) = len;
    if ((mpp_trie_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_trie","move trie node finish used %d\n","mpp_trie_last_info",
                 (ulong)*(uint *)((long)&root->tag_val + 4));
    }
    if ((mpp_trie_debug & 0x40) != 0) {
      mpp_trie_dump(p,"mpp_trie_last_info");
    }
    if ((mpp_trie_debug & 0x80) != 0) {
      mpp_trie_check(p,"shrink move node stage");
    }
    if ((mpp_trie_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_trie","create user buffer start\n","mpp_trie_last_info");
    }
    pos = *(int *)((long)&root->tag_val + 4) * 0x38;
    *(RK_S32 *)(root->next + 6) =
         pos + *(int *)(root->next + 0xc) * 4 + *(int *)(root[1].next + 10) +
         *(int *)(root[1].next + 0xe);
    _node_valid = mpp_osal_calloc("mpp_trie_last_info",(long)*(int *)(root->next + 6));
    if (_node_valid == (void *)0x0) {
      _mpp_log_l(2,"mpp_trie","failed to alloc trie buffer size %d\n",(char *)0x0,(ulong)(uint)i);
      trie_local._4_4_ = MPP_NOK;
    }
    else {
      *(void **)&root->key = _node_valid;
      memcpy(*(void **)&root->key,node,(long)pos);
      j = pos;
      for (local_58 = 0; (int)local_58 < *(int *)(root->next + 0xc); local_58 = local_58 + 1) {
        puVar5 = (uint *)(*(long *)&root->id + (long)(int)local_58 * 0x14);
        name_00 = (char *)(*(long *)(root[1].next + 4) + (long)(int)puVar5[4]);
        buf = (char *)mpp_trie_get_node(*(MppTrieNode **)&root->key,name_00);
        ((MppTrieNode *)buf)->id = j;
        puVar6 = (uint *)((long)_node_valid + (long)j);
        *puVar6 = *puVar6 & 0xfffff000 | *puVar5 & 0xfff;
        *puVar6 = *puVar6 & 0xff000fff | (puVar5[1] & 0xfff) << 0xc;
        *puVar6 = *puVar6 & 0xffffff | puVar5[2] << 0x18;
        j = j + 4;
        strncpy((char *)((long)_node_valid + (long)j),name_00,(ulong)(*puVar6 >> 0x18));
        j = (*puVar6 >> 0x18) + j;
        memcpy((void *)((long)_node_valid + (long)j),
               (void *)(*(long *)root[1].next + (long)(int)puVar5[3]),(long)(int)puVar5[1]);
        j = (*puVar6 >> 0xc & 0xfff) + j;
      }
      if (node != (MppTrieNode *)0x0) {
        mpp_osal_free("mpp_trie_last_info",node);
      }
      node = (MppTrieNode *)0x0;
      lVar2._0_4_ = root->id;
      lVar2._4_2_ = root->idx;
      lVar2._6_2_ = root->prev;
      if (lVar2 != 0) {
        mpp_osal_free("mpp_trie_last_info",*(void **)&root->id);
      }
      root->id = 0;
      root->idx = 0;
      root->prev = 0;
      if (*(long *)root[1].next != 0) {
        mpp_osal_free("mpp_trie_last_info",*(void **)root[1].next);
      }
      root[1].next[0] = 0;
      root[1].next[1] = 0;
      root[1].next[2] = 0;
      root[1].next[3] = 0;
      if (*(long *)(root[1].next + 4) != 0) {
        mpp_osal_free("mpp_trie_last_info",*(void **)(root[1].next + 4));
      }
      root[1].next[4] = 0;
      root[1].next[5] = 0;
      root[1].next[6] = 0;
      root[1].next[7] = 0;
      info_00 = mpp_trie_get_info_from_root(*(void **)&root->key,"__node__");
      if (info_00 != (MppTrieInfo *)0x0) {
        uVar8 = *(undefined4 *)((long)&root->tag_val + 4);
        puVar7 = (undefined4 *)mpp_trie_info_ctx(info_00);
        *puVar7 = uVar8;
      }
      trie_local._4_4_ = MPP_OK;
    }
  }
  return trie_local._4_4_;
LAB_00150225:
  RVar3 = (RK_S16)local_58;
  if (0xf < src._4_4_) goto LAB_00150264;
  if (node[pMVar4->prev].next[src._4_4_] == pMVar4->idx) {
    node[pMVar4->prev].next[src._4_4_] = RVar3;
    goto LAB_00150264;
  }
  src._4_4_ = src._4_4_ + 1;
  goto LAB_00150225;
LAB_00150264:
  memcpy(buf,pMVar4,0x38);
  *(RK_S16 *)(buf + 0x24) = RVar3;
  memset(pMVar4,0,0x38);
  for (src._4_4_ = 0; src._4_4_ < 0x10; src._4_4_ = src._4_4_ + 1) {
    if (*(short *)(buf + (long)src._4_4_ * 2) != 0) {
      node[*(short *)(buf + (long)src._4_4_ * 2)].prev = RVar3;
    }
  }
LAB_001502f1:
  local_58 = local_58 + 1;
  goto LAB_00150159;
}

Assistant:

MPP_RET mpp_trie_last_info(MppTrie trie)
{
    MppTrieImpl *p = (MppTrieImpl *)trie;
    MppTrieNode *root;
    MppTrieNode *node;
    char *buf;
    RK_S32 node_count;
    RK_S32 node_valid;
    RK_S32 nodes_size;
    RK_S32 len = 0;
    RK_S32 pos = 0;
    RK_S32 i;
    RK_S32 j;

    if (!trie) {
        mpp_err_f("invalid NULL trie\n");
        return MPP_ERR_NULL_PTR;
    }

    /* write trie self entry info */
    pos = p->info_used + 3;
    mpp_trie_add_info(trie, "__name__", p->name, p->name_len);
    mpp_trie_add_info(trie, "__info__", &pos, sizeof(pos));
    /* NOTE: node count need to be update after shrinking */
    mpp_trie_add_info(trie, "__node__", &p->node_used, sizeof(p->node_used));

    root = p->nodes;
    node_count = p->node_used;
    node_valid = node_count;

    trie_dbg_last("shrink trie node start node %d info %d\n", node_count, p->info_used);

    if (mpp_trie_debug & MPP_TRIE_DBG_LAST_STEP)
        mpp_trie_dump_f(trie);

    for (i = node_count - 1; i > 0; i--) {
        MppTrieNode *prev;
        RK_S32 prev_idx;

        node = &root[i];
        prev_idx = node->prev;
        prev = &root[prev_idx];

        if (prev->next_cnt > 1) {
            trie_dbg_last("node %d:%d prev %d next count %d stop shrinking for multi next\n",
                          i, node->id, prev_idx, prev->next_cnt);
            continue;
        }

        if (node->tag_len >= (RK_S16)MPP_TRIE_TAG_LEN_MAX) {
            trie_dbg_last("node %d:%d tag %d - %016llx stop shrinking for max tag len\n",
                          i, node->id, node->tag_len, node->tag_val);
            continue;
        }

        if (prev->id >= 0) {
            trie_dbg_last("node %d:%d tag %d - %016llx stop shrinking for valid info node\n",
                          i, node->id, node->tag_len, node->tag_val);
            continue;
        }

        prev->id = node->id;
        /* NOTE: do NOT increase tag length on root node */
        prev->tag_len = node->tag_len + 1;
        prev->tag_val = ((RK_U64)node->key << (node->tag_len * 4)) | node->tag_val;
        prev->next_cnt = node->next_cnt;
        memcpy(prev->next, node->next, sizeof(node->next));

        trie_dbg_last("node %d:%d shrink prev %d key %x tag %016llx -> %016llx\n",
                      i, node->id, prev->idx, prev->key, node->tag_val, prev->tag_val);

        for (j = 0; j < MPP_TRIE_KEY_MAX; j++) {
            if (!prev->next[j])
                continue;

            root[prev->next[j]].prev = prev_idx;
        }

        memset(node, 0, sizeof(*node));
        node->id = INVALID_NODE_ID;
        node_valid--;
    }

    trie_dbg_last("shrink trie node finish count %d -> %d\n", node_count, node_valid);

    if (mpp_trie_debug & MPP_TRIE_DBG_LAST_STEP)
        mpp_trie_dump_f(trie);

    if (mpp_trie_debug & MPP_TRIE_DBG_LAST_CHECK)
        mpp_trie_check(trie, "shrink merge tag stage");

    trie_dbg_last("move trie node start to reduce memory %d -> %d\n", node_count, node_valid);

    for (i = 1; i < node_valid; i++) {
        node = &root[i];

        /* skip valid node */
        if (node->idx)
            continue;

        for (j = i; j < node_count; j++) {
            MppTrieNode *tmp = &root[j];
            MppTrieNode *prev;
            RK_S32 k;

            /* skip empty node */
            if (!tmp->idx)
                continue;

            trie_dbg_last("move node %d to %d prev %d\n", j, i, tmp->prev);

            prev = &root[tmp->prev];

            /* relink previous node */
            for (k = 0; k < MPP_TRIE_KEY_MAX; k++) {
                if (prev->next[k] != tmp->idx)
                    continue;

                prev->next[k] = i;
                break;
            }

            memcpy(node, tmp, sizeof(*node));
            node->idx = i;
            memset(tmp, 0, sizeof(*tmp));

            /* relink next node */
            for (k = 0; k < MPP_TRIE_KEY_MAX; k++) {
                if (!node->next[k])
                    continue;

                root[node->next[k]].prev = i;
            }

            break;
        }
    }

    p->node_used = node_valid;

    trie_dbg_last("move trie node finish used %d\n", p->node_used);

    if (mpp_trie_debug & MPP_TRIE_DBG_LAST_STEP)
        mpp_trie_dump_f(trie);

    if (mpp_trie_debug & MPP_TRIE_DBG_LAST_CHECK)
        mpp_trie_check(trie, "shrink move node stage");

    trie_dbg_last("create user buffer start\n");

    nodes_size = sizeof(MppTrieNode) * p->node_used;
    p->buf_size = nodes_size + sizeof(MppTrieInfo) * p->info_used + p->info_buf_pos + p->name_buf_pos;

    buf = mpp_calloc_size(char, p->buf_size);
    if (!buf) {
        mpp_loge("failed to alloc trie buffer size %d\n", len);
        return MPP_NOK;
    }

    p->nodes = (MppTrieNode *)buf;
    memcpy(p->nodes, root, nodes_size);
    pos = nodes_size;

    for (i = 0; i < p->info_used; i++) {
        MppTrieInfoInt *src = &p->info[i];
        MppTrieInfo *dst;
        const char *name = (char *)p->name_buf + src->name_offset;

        node = mpp_trie_get_node(p->nodes, name);
        node->id = pos;

        /* reserve node info */
        dst = (MppTrieInfo *)(buf + pos);
        dst->index = src->index;
        dst->ctx_len = src->ctx_len;
        dst->str_len = src->str_len;
        pos += sizeof(MppTrieInfo);

        /* copy info name */
        strncpy(buf + pos, name, dst->str_len);
        pos += dst->str_len;

        /* reserve user context space */
        memcpy(buf + pos, (char *)p->info_buf + src->ctx_offset, src->ctx_len);
        pos += dst->ctx_len;
    }

    MPP_FREE(root);
    MPP_FREE(p->info);
    MPP_FREE(p->info_buf);
    MPP_FREE(p->name_buf);

    /* NOTE: udpate final shrinked node count */
    {
        MppTrieInfo *info = mpp_trie_get_info_from_root(p->nodes, "__node__");

        if (info)
            *(RK_U32 *)mpp_trie_info_ctx(info) = p->node_used;
    }

    return MPP_OK;
}